

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicAndCase::getInputs
          (ShaderAtomicAndCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  Precision PVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  Random rnd;
  deRandom local_40;
  
  dVar3 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar3);
  lVar6 = 0;
  uVar9 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar8 = uVar9;
    uVar1 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar6 + 1];
    uVar9 = uVar1 * uVar8;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 2);
  PVar2 = (this->super_ShaderAtomicOpCase).m_precision;
  iVar7 = 0x20;
  if (PVar2 != PRECISION_HIGHP) {
    iVar7 = (uint)(PVar2 == PRECISION_MEDIUMP) * 8 + 8;
  }
  uVar10 = ~(-1 << ((byte)iVar7 & 0x1f));
  if (PVar2 == PRECISION_HIGHP) {
    uVar10 = 0xffffffff;
  }
  if (0 < numValues / (int)uVar9) {
    iVar11 = 0;
    iVar5 = 0;
    do {
      dVar3 = deRandom_getUint32(&local_40);
      uVar13 = (ulong)uVar9;
      iVar12 = iVar11;
      if (0 < (int)uVar9) {
        do {
          dVar4 = deRandom_getUint32(&local_40);
          *(deUint32 *)((long)inputs + (long)iVar12) =
               dVar4 & uVar10 | 1 << ((byte)(dVar3 % (iVar7 - 1U)) & 0x1f);
          iVar12 = iVar12 + stride;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      iVar5 = iVar5 + 1;
      iVar11 = iVar11 + uVar8 * stride * uVar1;
    } while (iVar5 != numValues / (int)uVar9);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;
		const int		numBits			= m_precision == PRECISION_HIGHP ? 32 :
										  m_precision == PRECISION_MEDIUMP ? 16 : 8;
		const deUint32	valueMask		= numBits == 32 ? ~0u : (1u<<numBits)-1u;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int		groupOffset		= groupNdx*workGroupSize;
			const deUint32	groupMask		= 1<<rnd.getInt(0, numBits-2); // One bit is always set.

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = (rnd.getUint32() & valueMask) | groupMask;
		}
	}